

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write.c
# Opt level: O0

int archive_write_client_write(archive_write_filter *f,void *_buff,size_t length)

{
  archive *a_00;
  ulong *puVar1;
  long lVar2;
  ulong uVar3;
  ulong in_RDX;
  void *in_RSI;
  long in_RDI;
  size_t to_write;
  char *p;
  ssize_t bytes_written;
  ssize_t to_copy;
  ssize_t remaining;
  char *buff;
  archive_none *state;
  archive_write *a;
  size_t local_68;
  ulong local_60;
  ulong local_58;
  ulong local_40;
  void *local_38;
  
  a_00 = *(archive **)(in_RDI + 8);
  puVar1 = *(ulong **)(in_RDI + 0x40);
  local_40 = in_RDX;
  local_38 = in_RSI;
  if (*puVar1 == 0) {
    for (; 0 < (long)local_40; local_40 = local_40 - lVar2) {
      lVar2 = (**(code **)&a_00[1].file_count)(a_00,a_00[1].error_string.s,local_38,local_40);
      if (lVar2 < 1) {
        return -0x1e;
      }
      local_38 = (void *)(lVar2 + (long)local_38);
    }
  }
  else {
    if (puVar1[1] < *puVar1) {
      local_68 = in_RDX;
      if (puVar1[1] < in_RDX) {
        local_68 = puVar1[1];
      }
      memcpy((void *)puVar1[3],in_RSI,local_68);
      puVar1[3] = local_68 + puVar1[3];
      puVar1[1] = puVar1[1] - local_68;
      local_38 = (void *)(local_68 + (long)in_RSI);
      local_40 = in_RDX - local_68;
      if (puVar1[1] == 0) {
        local_58 = puVar1[2];
        for (local_60 = *puVar1; local_60 != 0; local_60 = local_60 - uVar3) {
          uVar3 = (**(code **)&a_00[1].file_count)(a_00,a_00[1].error_string.s,local_58,local_60);
          if ((long)uVar3 < 1) {
            return -0x1e;
          }
          if (local_60 < uVar3) {
            archive_set_error(a_00,-1,"write overrun");
            return -0x1e;
          }
          local_58 = uVar3 + local_58;
        }
        puVar1[3] = puVar1[2];
        puVar1[1] = *puVar1;
      }
    }
    for (; *puVar1 <= local_40; local_40 = local_40 - lVar2) {
      lVar2 = (**(code **)&a_00[1].file_count)(a_00,a_00[1].error_string.s,local_38,*puVar1);
      if (lVar2 < 1) {
        return -0x1e;
      }
      local_38 = (void *)(lVar2 + (long)local_38);
    }
    if (0 < (long)local_40) {
      memcpy((void *)puVar1[3],local_38,local_40);
      puVar1[3] = local_40 + puVar1[3];
      puVar1[1] = puVar1[1] - local_40;
    }
  }
  return 0;
}

Assistant:

static int
archive_write_client_write(struct archive_write_filter *f,
    const void *_buff, size_t length)
{
	struct archive_write *a = (struct archive_write *)f->archive;
        struct archive_none *state = (struct archive_none *)f->data;
	const char *buff = (const char *)_buff;
	ssize_t remaining, to_copy;
	ssize_t bytes_written;

	remaining = length;

	/*
	 * If there is no buffer for blocking, just pass the data
	 * straight through to the client write callback.  In
	 * particular, this supports "no write delay" operation for
	 * special applications.  Just set the block size to zero.
	 */
	if (state->buffer_size == 0) {
		while (remaining > 0) {
			bytes_written = (a->client_writer)(&a->archive,
			    a->client_data, buff, remaining);
			if (bytes_written <= 0)
				return (ARCHIVE_FATAL);
			remaining -= bytes_written;
			buff += bytes_written;
		}
		return (ARCHIVE_OK);
	}

	/* If the copy buffer isn't empty, try to fill it. */
	if (state->avail < state->buffer_size) {
		/* If buffer is not empty... */
		/* ... copy data into buffer ... */
		to_copy = ((size_t)remaining > state->avail) ?
			state->avail : (size_t)remaining;
		memcpy(state->next, buff, to_copy);
		state->next += to_copy;
		state->avail -= to_copy;
		buff += to_copy;
		remaining -= to_copy;
		/* ... if it's full, write it out. */
		if (state->avail == 0) {
			char *p = state->buffer;
			size_t to_write = state->buffer_size;
			while (to_write > 0) {
				bytes_written = (a->client_writer)(&a->archive,
				    a->client_data, p, to_write);
				if (bytes_written <= 0)
					return (ARCHIVE_FATAL);
				if ((size_t)bytes_written > to_write) {
					archive_set_error(&(a->archive),
					    -1, "write overrun");
					return (ARCHIVE_FATAL);
				}
				p += bytes_written;
				to_write -= bytes_written;
			}
			state->next = state->buffer;
			state->avail = state->buffer_size;
		}
	}

	while ((size_t)remaining >= state->buffer_size) {
		/* Write out full blocks directly to client. */
		bytes_written = (a->client_writer)(&a->archive,
		    a->client_data, buff, state->buffer_size);
		if (bytes_written <= 0)
			return (ARCHIVE_FATAL);
		buff += bytes_written;
		remaining -= bytes_written;
	}

	if (remaining > 0) {
		/* Copy last bit into copy buffer. */
		memcpy(state->next, buff, remaining);
		state->next += remaining;
		state->avail -= remaining;
	}
	return (ARCHIVE_OK);
}